

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  XmlWriter *this_00;
  IConfig *pIVar2;
  long in_RDI;
  ScopedElement e;
  SectionStats *in_stack_fffffffffffffec8;
  StreamingReporterBase *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  ScopedElement *in_stack_fffffffffffffee0;
  allocator *paVar3;
  string *in_stack_fffffffffffffef0;
  XmlWriter *this_01;
  undefined1 local_e9 [40];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  
  StreamingReporterBase::sectionEnded(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  iVar1 = *(int *)(in_RDI + 0x218) + -1;
  *(int *)(in_RDI + 0x218) = iVar1;
  if (0 < iVar1) {
    this_00 = (XmlWriter *)(in_RDI + 0x1d0);
    this_01 = (XmlWriter *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc8,"OverallResults",(allocator *)this_01);
    XmlWriter::scopedElement(this_00,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"successes",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,
               (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (unsigned_long *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"failures",&local_99);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              (in_stack_fffffffffffffee0,
               (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (unsigned_long *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    paVar3 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"expectedFailures",paVar3);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long>
              ((ScopedElement *)paVar3,
               (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (unsigned_long *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)(in_RDI + 0x10));
    iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
    if (iVar1 == 1) {
      in_stack_fffffffffffffed0 = (StreamingReporterBase *)local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_e9 + 1),"durationInSeconds",(allocator *)in_stack_fffffffffffffed0
                );
      XmlWriter::ScopedElement::writeAttribute<double>
                ((ScopedElement *)paVar3,(string *)CONCAT44(iVar1,in_stack_fffffffffffffed8),
                 (double *)in_stack_fffffffffffffed0);
      std::__cxx11::string::~string((string *)(local_e9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_e9);
    }
    XmlWriter::endElement(this_01);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffed0);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& sectionStats ) {
            StreamingReporterBase::sectionEnded( sectionStats );
            if( --m_sectionDepth > 0 ) {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes", sectionStats.assertions.passed );
                e.writeAttribute( "failures", sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

                m_xml.endElement();
            }
        }